

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_filter_bank_analysis.cc
# Opt level: O2

bool __thiscall
sptk::MelFilterBankAnalysis::Run
          (MelFilterBankAnalysis *this,vector<double,_std::allocator<double>_> *power_spectrum,
          vector<double,_std::allocator<double>_> *filter_bank_output,double *energy)

{
  uint uVar1;
  pointer piVar2;
  pointer pdVar3;
  double *pdVar4;
  pointer pdVar5;
  int m;
  bool bVar6;
  pointer pdVar7;
  long lVar8;
  double dVar9;
  
  if (this->is_valid_ == true) {
    bVar6 = false;
    if ((filter_bank_output != (vector<double,_std::allocator<double>_> *)0x0) &&
       (bVar6 = false,
       (long)(power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == (long)(this->fft_length_ / 2 + 1))) {
      pdVar5 = (filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar7 = pdVar5;
      if ((long)pdVar3 - (long)pdVar5 >> 3 != (long)this->num_channel_) {
        std::vector<double,_std::allocator<double>_>::resize
                  (filter_bank_output,(long)this->num_channel_);
        pdVar5 = (filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pdVar7 = pdVar5;
      }
      for (; pdVar5 != pdVar3; pdVar5 = pdVar5 + 1) {
        *pdVar5 = 0.0;
      }
      piVar2 = (this->channel_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->channel_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar8 = (long)this->lower_bin_index_; lVar8 < this->upper_bin_index_; lVar8 = lVar8 + 1)
      {
        uVar1 = piVar2[lVar8];
        dVar9 = pdVar3[lVar8];
        if (this->use_power_ == false) {
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
        }
        if (0 < (int)uVar1) {
          pdVar7[(ulong)uVar1 - 1] = pdVar5[lVar8] * dVar9 + pdVar7[(ulong)uVar1 - 1];
        }
        if ((int)uVar1 < this->num_channel_) {
          pdVar7[(int)uVar1] = dVar9 * (1.0 - pdVar5[lVar8]) + pdVar7[(int)uVar1];
        }
      }
      for (lVar8 = 0; lVar8 < this->num_channel_; lVar8 = lVar8 + 1) {
        dVar9 = this->floor_;
        if (this->floor_ <= pdVar7[lVar8]) {
          dVar9 = pdVar7[lVar8];
        }
        dVar9 = log(dVar9);
        pdVar7[lVar8] = dVar9;
      }
      bVar6 = true;
      if (energy != (double *)0x0) {
        pdVar4 = (power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        dVar9 = *pdVar4 + pdVar5[-1];
        while (pdVar4 = pdVar4 + 1, pdVar4 != pdVar5 + -1) {
          dVar9 = dVar9 + *pdVar4 + *pdVar4;
        }
        dVar9 = log(dVar9 / (double)this->fft_length_);
        *energy = dVar9;
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool MelFilterBankAnalysis::Run(const std::vector<double>& power_spectrum,
                                std::vector<double>* filter_bank_output,
                                double* energy) const {
  // Check inputs.
  if (!is_valid_ ||
      power_spectrum.size() != static_cast<std::size_t>(fft_length_ / 2 + 1) ||
      NULL == filter_bank_output) {
    return false;
  }

  // Prepare memories.
  if (filter_bank_output->size() != static_cast<std::size_t>(num_channel_)) {
    filter_bank_output->resize(num_channel_);
  }

  std::fill(filter_bank_output->begin(), filter_bank_output->end(), 0.0);

  // Apply mel-filter-banks.
  const int* map(&(channel_indices_[0]));
  const double* w(&(channel_weights_[0]));
  const double* input(&(power_spectrum[0]));
  double* output(&((*filter_bank_output)[0]));
  for (int k(lower_bin_index_); k < upper_bin_index_; ++k) {
    const int m(map[k]);
    const double x(use_power_ ? input[k] : std::sqrt(input[k]));
    if (0 < m) {
      output[m - 1] += x * w[k];
    }
    if (m < num_channel_) {
      output[m] += x * (1.0 - w[k]);
    }
  }

  // Apply logarithm function.
  for (int m(0); m < num_channel_; ++m) {
    if (output[m] < floor_) output[m] = floor_;
    output[m] = std::log(output[m]);
  }

  if (NULL != energy) {
    const double sum(
        std::accumulate(power_spectrum.begin() + 1, power_spectrum.end() - 1,
                        power_spectrum.front() + power_spectrum.back(),
                        [](double a, double x) { return a + 2.0 * x; }));
    *energy = std::log(sum / fft_length_);
  }

  return true;
}